

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Error T1_Get_MM_Blend(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  PS_Blend pPVar1;
  uint local_60;
  uint local_5c;
  FT_UInt nc;
  FT_UInt i;
  FT_Fixed axiscoords [4];
  PS_Blend blend;
  FT_Fixed *coords_local;
  FT_UInt num_coords_local;
  T1_Face face_local;
  
  pPVar1 = face->blend;
  if (pPVar1 == (PS_Blend)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    mm_weights_unmap(pPVar1->weight_vector,(FT_Fixed *)&nc,pPVar1->num_axis);
    local_60 = num_coords;
    if (pPVar1->num_axis < num_coords) {
      local_60 = pPVar1->num_axis;
    }
    for (local_5c = 0; local_5c < local_60; local_5c = local_5c + 1) {
      coords[local_5c] = *(FT_Fixed *)(&nc + (ulong)local_5c * 2);
    }
    for (; local_5c < num_coords; local_5c = local_5c + 1) {
      coords[local_5c] = 0x8000;
    }
    face_local._4_4_ = 0;
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_MM_Blend( T1_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    PS_Blend  blend = face->blend;

    FT_Fixed  axiscoords[4];
    FT_UInt   i, nc;


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    mm_weights_unmap( blend->weight_vector,
                      axiscoords,
                      blend->num_axis );

    nc = num_coords;
    if ( num_coords > blend->num_axis )
    {
      FT_TRACE2(( "T1_Get_MM_Blend: only using first %d of %d coordinates\n",
                  blend->num_axis, num_coords ));
      nc = blend->num_axis;
    }

    for ( i = 0; i < nc; i++ )
      coords[i] = axiscoords[i];
    for ( ; i < num_coords; i++ )
      coords[i] = 0x8000;

    return FT_Err_Ok;
  }